

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedAttributeWithFallback<std::array<float,_4UL>_>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<std::array<float,_4UL>_> *this,
          TypedAttributeWithFallback<std::array<float,_4UL>_> *param_1)

{
  bool bVar1;
  pointer pPVar2;
  undefined8 uVar3;
  undefined3 uVar4;
  float fVar5;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  pPVar2 = (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = pPVar2;
  (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = (param_1->_attrib).has_value_;
  (this->_attrib).has_value_ = bVar1;
  if (bVar1 == true) {
    uVar3 = *(undefined8 *)((long)&(param_1->_attrib).contained + 8);
    *(undefined8 *)&(this->_attrib).contained = *(undefined8 *)&(param_1->_attrib).contained;
    *(undefined8 *)((long)&(this->_attrib).contained + 8) = uVar3;
  }
  *(undefined8 *)((long)(this->_fallback)._M_elems + 9) =
       *(undefined8 *)((long)(param_1->_fallback)._M_elems + 9);
  uVar4 = *(undefined3 *)&param_1->field_0x235;
  fVar5 = (param_1->_fallback)._M_elems[0];
  uVar3 = *(undefined8 *)((param_1->_fallback)._M_elems + 1);
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x235 = uVar4;
  (this->_fallback)._M_elems[0] = fVar5;
  *(undefined8 *)((this->_fallback)._M_elems + 1) = uVar3;
  return;
}

Assistant:

static uint32_t type_id() { return value::TypeTraits<T>::type_id(); }